

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O3

bool absl::debugging_internal::ParseSourceName(State *state)

{
  ulong uVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  bool bVar7;
  int iVar8;
  size_t i;
  long lVar9;
  char cVar10;
  long lVar11;
  char cVar12;
  ulong uVar13;
  ulong uVar14;
  int length;
  ParseState copy;
  uint local_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  
  iVar8 = state->recursion_depth;
  iVar2 = state->steps;
  state->recursion_depth = iVar8 + 1;
  state->steps = iVar2 + 1;
  if (0x1ffff < iVar2 || 0xff < iVar8) {
    bVar7 = false;
    goto LAB_0014bf85;
  }
  local_28._0_4_ = (state->parse_state).mangled_idx;
  local_28._4_4_ = (state->parse_state).out_cur_idx;
  uStack_20 = *(undefined8 *)&(state->parse_state).prev_name_idx;
  local_2c = 0xffffffff;
  bVar7 = ParseNumber(state,(int *)&local_2c);
  uVar5 = local_2c;
  iVar8 = state->recursion_depth;
  if (bVar7) {
    uVar14 = (ulong)local_2c;
    state->recursion_depth = iVar8 + 1;
    iVar2 = state->steps;
    state->steps = iVar2 + 1;
    if ((0xff < iVar8) || ((int)local_2c < 0 || 0x1ffff < iVar2)) goto LAB_0014bf75;
    pcVar3 = state->mangled_begin;
    lVar11 = (long)(state->parse_state).mangled_idx;
    if (uVar14 == 0) goto LAB_0014bff6;
    cVar10 = pcVar3[lVar11];
    if (cVar10 == '\0') goto LAB_0014bf75;
    lVar4 = lVar11 + 1;
    uVar13 = 0;
    do {
      if (uVar14 - 1 == uVar13) goto LAB_0014bfcb;
      uVar1 = uVar13 + 1;
      lVar6 = uVar13 + lVar4;
      uVar13 = uVar1;
    } while (pcVar3[lVar6] != '\0');
    if (uVar1 < uVar14) goto LAB_0014bf75;
LAB_0014bfcb:
    if ((int)local_2c < 0xc) {
LAB_0014bff6:
      MaybeAppendWithLength(state,pcVar3 + lVar11,local_2c);
    }
    else {
      lVar6 = 0;
      do {
        lVar9 = lVar6;
        cVar12 = (&IdentifierIsAnonymousNamespace(absl::debugging_internal::State*,int)::anon_prefix
                 )[lVar9];
        if (cVar10 != cVar12) goto LAB_0014bff1;
        cVar10 = pcVar3[lVar9 + lVar4];
        lVar6 = lVar9 + 1;
      } while (cVar10 != '\0');
      cVar12 = (&DAT_00166f31)[lVar9];
LAB_0014bff1:
      if (cVar12 != '\0') goto LAB_0014bff6;
      MaybeAppend(state,"(anonymous namespace)");
    }
    (state->parse_state).mangled_idx = (state->parse_state).mangled_idx + uVar5;
    iVar8 = state->recursion_depth + -1;
    bVar7 = true;
  }
  else {
LAB_0014bf75:
    (state->parse_state).mangled_idx = (undefined4)local_28;
    (state->parse_state).out_cur_idx = local_28._4_4_;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uStack_20;
    bVar7 = false;
  }
  iVar8 = iVar8 + -1;
LAB_0014bf85:
  state->recursion_depth = iVar8;
  return bVar7;
}

Assistant:

static bool ParseSourceName(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  ParseState copy = state->parse_state;
  int length = -1;
  if (ParseNumber(state, &length) && ParseIdentifier(state, length)) {
    return true;
  }
  state->parse_state = copy;
  return false;
}